

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O1

void __thiscall
duckdb::MetadataReader::ReadData(MetadataReader *this,data_ptr_t buffer,idx_t read_size)

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  idx_t iVar4;
  size_t __n;
  
  iVar1 = this->offset;
  uVar3 = iVar1 + read_size;
  iVar4 = this->capacity;
  while (iVar4 < uVar3) {
    __n = iVar4 - iVar1;
    if (__n != 0) {
      pdVar2 = BasePtr(this);
      switchD_00b1522a::default(buffer,pdVar2 + this->offset,__n);
      read_size = read_size - __n;
      buffer = buffer + __n;
      this->offset = this->offset + read_size;
    }
    ReadNextBlock(this);
    iVar1 = this->offset;
    uVar3 = iVar1 + read_size;
    iVar4 = this->capacity;
  }
  pdVar2 = BasePtr(this);
  switchD_00b1522a::default(buffer,pdVar2 + this->offset,read_size);
  this->offset = this->offset + read_size;
  return;
}

Assistant:

void MetadataReader::ReadData(data_ptr_t buffer, idx_t read_size) {
	while (offset + read_size > capacity) {
		// cannot read entire entry from block
		// first read what we can from this block
		idx_t to_read = capacity - offset;
		if (to_read > 0) {
			memcpy(buffer, Ptr(), to_read);
			read_size -= to_read;
			buffer += to_read;
			offset += read_size;
		}
		// then move to the next block
		ReadNextBlock();
	}
	// we have enough left in this block to read from the buffer
	memcpy(buffer, Ptr(), read_size);
	offset += read_size;
}